

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

vm_obj_id_t CVmObjGramProd::create_from_stack(uchar **pc_ptr,uint argc)

{
  byte *pbVar1;
  vm_obj_id_t obj_id;
  CVmObjGramProd *this;
  
  obj_id = vm_new_id(0,1,1);
  this = (CVmObjGramProd *)CVmObject::operator_new(0x10,obj_id);
  CVmObjGramProd(this);
  pbVar1 = (byte *)(*(long *)((long)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].ptr_ + 8) +
                   0x14);
  *pbVar1 = *pbVar1 | 1;
  if (argc == 0) {
    return obj_id;
  }
  err_throw(0x899);
}

Assistant:

vm_obj_id_t CVmObjGramProd::create_from_stack(VMG_ const uchar **pc_ptr,
                                              uint argc)
{
    /* create an empty new grammar production */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, TRUE, TRUE);
    new (vmg_ id) CVmObjGramProd(vmg0_);
    CVmObjGramProd *prod = (CVmObjGramProd *)vm_objp(vmg_ id);

    /* 
     *   mark the object as modified-since-load, since it was never part of
     *   the image file 
     */
    prod->get_ext()->modified_ = TRUE;

    /* check arguments */
    if (argc == 0)
    {
        /* no arguments - create a new production with no rules defined */
    }
    else
    {
        /* invalid argument list */
        err_throw(VMERR_WRONG_NUM_OF_ARGS);
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new ID */
    return id;
}